

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtpaths.cpp
# Opt level: O1

StringEnum * parseLocationOrError(QString *locationString)

{
  char16_t *pcVar1;
  long lVar2;
  char *pcVar3;
  StringEnum *pSVar4;
  long lVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  StringEnum *unaff_R14;
  long in_FS_OFFSET;
  bool bVar10;
  QStringView QVar11;
  QLatin1String QVar12;
  QArrayDataPointer<char16_t> local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (locationString->d).ptr;
  lVar2 = (locationString->d).size;
  bVar10 = false;
  lVar9 = 0;
  do {
    pcVar3 = *(char **)((long)&lookupTableData[0].stringvalue + lVar9);
    if (pcVar3 == (char *)0x0) {
      lVar8 = 0;
    }
    else {
      lVar7 = -1;
      do {
        lVar8 = lVar7 + 1;
        lVar5 = lVar7 + 1;
        lVar7 = lVar8;
      } while (pcVar3[lVar5] != '\0');
    }
    if (lVar2 == lVar8) {
      QVar11.m_data = pcVar1;
      QVar11.m_size = lVar2;
      QVar12.m_data = pcVar3;
      QVar12.m_size = lVar8;
      cVar6 = QtPrivate::equalStrings(QVar11,QVar12);
    }
    else {
      cVar6 = '\0';
    }
    pSVar4 = (StringEnum *)((long)&lookupTableData[0].stringvalue + lVar9);
    if (cVar6 != '\0') break;
    lVar9 = lVar9 + 0x10;
    bVar10 = lVar9 == 0x170;
    pSVar4 = unaff_R14;
  } while (!bVar10);
  if (bVar10) {
    local_70.ptr = (char16_t *)0x0;
    local_70.d = (Data *)0x0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = L"Unknown location: %1";
    local_70.size = 0;
    local_58.d.size = 0x14;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QString::arg<QString,_true>((QString *)&local_70,&local_58,locationString,0,(QChar)0x20);
    error((QString *)&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pSVar4;
  }
  __stack_chk_fail();
}

Assistant:

static const StringEnum &parseLocationOrError(const QString &locationString)
{
    for (const StringEnum &se : lookupTableData)
        if (locationString == QLatin1StringView(se.stringvalue))
            return se;

    QString message = QStringLiteral("Unknown location: %1");
    error(message.arg(locationString));
}